

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O3

uint __thiscall CTransaction::GetTotalSize(CTransaction *this)

{
  long in_FS_OFFSET;
  SizeComputer local_28;
  ParamsStream<SizeComputer_&,_TransactionSerParams> local_20;
  long local_10;
  
  local_20.m_substream = &local_28;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.nSize = 0;
  local_20.m_params = &::TX_WITH_WITNESS;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            (this,&local_20,&::TX_WITH_WITNESS);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (uint)local_28.nSize;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int CTransaction::GetTotalSize() const
{
    return ::GetSerializeSize(TX_WITH_WITNESS(*this));
}